

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O1

Id dxil_spv::build_allocate_invocation_id_function
             (SPIRVModule *module,uint32_t desc_set,uint32_t binding)

{
  iterator iVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Function *pFVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Block *entry;
  uint32_t in_stack_ffffffffffffff80;
  Vector<Id> local_78;
  Block *local_58;
  Block *local_50;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  this = SPIRVModule::get_builder(module);
  local_58 = this->buildPoint;
  local_50 = (Block *)0x0;
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = build_instrumentation_ssbo
                    (module,IVar2,4,"BloomBufferInvocationSSBO","BloomBufferInvocation",
                     (char *)(ulong)desc_set,binding,in_stack_ffffffffffffff80);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar5 = spv::Builder::makeFunctionEntry
                     (this,DecorationMax,IVar2,"AllocateInvocationID",&local_78,&local_48,&local_50)
  ;
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_48);
  if (local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_78.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pIVar6 = spv::Builder::addInstruction(this,IVar2,OpArrayLength);
  iVar1._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = IVar3;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current = IVar3;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  iVar1._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current = 0;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpISub);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar6->resultId;
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this,IVar4,1,false);
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
  pIVar6 = spv::Builder::addInstruction(this,IVar4,OpAccessChain);
  iVar1._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = IVar3;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current = IVar3;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = IVar3;
  }
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this,IVar3,0,false);
  iVar1._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar7->resultId;
  iVar1._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpAtomicIAdd);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar6->resultId;
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this,IVar2,1,false);
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this,IVar2,0,false);
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current =
         (uint)local_78.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar2 = spv::Builder::makeIntConstant(this,IVar2,0x41c81b37,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_78.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar2);
  iVar1._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar1,(uint *)&local_78);
  }
  else {
    *iVar1._M_current = IVar2;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  spv::Builder::makeReturn(this,false,pIVar7->resultId);
  this->buildPoint = local_58;
  return (pFVar5->functionInstruction).resultId;
}

Assistant:

spv::Id build_allocate_invocation_id_function(SPIRVModule &module, uint32_t desc_set, uint32_t binding)
{
	auto &builder = module.get_builder();
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);

	spv::Id bloom_var_id = build_instrumentation_ssbo(
		module, uint_type, 4, "atomics", "BloomBufferInvocationSSBO", "BloomBufferInvocation", desc_set, binding);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type, "AllocateInvocationID",
	                                       {}, {}, &entry);

	auto *len = builder.addInstruction(uint_type, spv::OpArrayLength);
	len->addIdOperand(bloom_var_id);
	len->addImmediateOperand(0);

	auto *len_minus_1 = builder.addInstruction(uint_type, spv::OpISub);
	len_minus_1->addIdOperand(len->getResultId());
	len_minus_1->addIdOperand(builder.makeUintConstant(1));

	auto *chain = builder.addInstruction(builder.makePointer(spv::StorageClassStorageBuffer, uint_type), spv::OpAccessChain);
	chain->addIdOperand(bloom_var_id);
	chain->addIdOperand(builder.makeUintConstant(0));
	chain->addIdOperand(len_minus_1->getResultId());

	auto *atomic_add = builder.addInstruction(uint_type, spv::OpAtomicIAdd);
	atomic_add->addIdOperand(chain->getResultId());
	atomic_add->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_add->addIdOperand(builder.makeUintConstant(0));
	atomic_add->addIdOperand(builder.makeUintConstant(1103633207u));

	builder.makeReturn(false, atomic_add->getResultId());
	builder.setBuildPoint(current_build_point);
	return func->getId();
}